

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

bool __thiscall QGles2RenderBuffer::createFrom(QGles2RenderBuffer *this,NativeRenderBuffer src)

{
  bool bVar1;
  int iVar2;
  QRhiResource *in_RSI;
  QRhiGles2 *in_RDI;
  long in_FS_OFFSET;
  int in_stack_0000000c;
  QRhiGles2 *rhiD;
  undefined4 in_stack_ffffffffffffffa8;
  Flag in_stack_ffffffffffffffac;
  QRhiImplementation *this_00;
  QRhiGles2 *this_01;
  bool local_29;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (QRhiResource *)0x0) {
    local_29 = false;
  }
  else {
    this_01 = in_RDI;
    if (*(int *)&(in_RDI->super_QRhiImplementation).resUpdPool.
                 super_QVLABase<QRhiResourceUpdateBatch_*>.super_QVLABaseBase.ptr != 0) {
      (**(code **)(*(long *)&(in_RDI->super_QRhiImplementation)._vptr_QRhiImplementation + 0x18))();
    }
    this_00 = (QRhiImplementation *)(in_RDI->super_QRhiImplementation).q;
    iVar2 = QRhiImplementation::effectiveSampleCount
                      (&this_01->super_QRhiImplementation,in_stack_0000000c);
    *(int *)(in_RDI->super_QRhiImplementation).resUpdPool.super_QVLAStorage<8UL,_8UL,_4LL>.array =
         iVar2;
    bVar1 = QFlags<QRhiRenderBuffer::Flag>::testFlag
                      ((QFlags<QRhiRenderBuffer::Flag> *)in_RDI,in_stack_ffffffffffffffac);
    if (bVar1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_01,(char *)this_00,(int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      QMessageLogger::warning
                (local_28,
                 "RenderBuffer: UsedWithSwapChainOnly is meaningless when importing an existing native object"
                );
    }
    bVar1 = QRhiGles2::ensureContext(this_01,(QSurface *)this_00);
    if (bVar1) {
      *(int *)&(in_RDI->super_QRhiImplementation).resUpdPool.
               super_QVLABase<QRhiResourceUpdateBatch_*>.super_QVLABaseBase.ptr = (int)in_RSI;
      (in_RDI->super_QRhiImplementation).resUpdPool.super_QVLAStorage<8UL,_8UL,_4LL>.array[4] = '\0'
      ;
      *(int *)((in_RDI->super_QRhiImplementation).resUpdPool.super_QVLAStorage<8UL,_8UL,_4LL>.array
              + 8) = *(int *)((in_RDI->super_QRhiImplementation).resUpdPool.
                              super_QVLAStorage<8UL,_8UL,_4LL>.array + 8) + 1;
      QRhiImplementation::registerResource(this_00,in_RSI,SUB81((ulong)this_01 >> 0x38,0));
      local_29 = true;
    }
    else {
      local_29 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_29;
}

Assistant:

bool QGles2RenderBuffer::createFrom(NativeRenderBuffer src)
{
    if (!src.object)
        return false;

    if (renderbuffer)
        destroy();

    QRHI_RES_RHI(QRhiGles2);
    samples = rhiD->effectiveSampleCount(m_sampleCount);

    if (m_flags.testFlag(UsedWithSwapChainOnly))
        qWarning("RenderBuffer: UsedWithSwapChainOnly is meaningless when importing an existing native object");

    if (!rhiD->ensureContext())
        return false;

    renderbuffer = src.object;

    owns = false;
    generation += 1;
    rhiD->registerResource(this);
    return true;
}